

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatGetID(SUNMatrix A,SUNMatrix_ID sunid,int myid)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  SUNMatrix in_RDI;
  double dVar2;
  double dVar3;
  SUNMatrix_ID mysunid;
  double stop_time;
  double start_time;
  int local_4;
  
  dVar2 = get_time();
  iVar1 = SUNMatGetID(in_RDI);
  sync_device(in_RDI);
  dVar3 = get_time();
  if (in_ESI == iVar1) {
    if ((print_all_ranks == 0) && (in_EDX == 0)) {
      printf("    PASSED test -- SUNMatGetID \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_EDX);
      printf("    PASSED test -- SUNMatGetID \n");
    }
    if ((in_EDX == 0) && (print_time != 0)) {
      printf("    SUNMatGetID Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  else {
    if ((print_all_ranks == 0) && (in_EDX == 0)) {
      printf(">>> FAILED test -- SUNMatGetID \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_EDX);
      printf(">>> FAILED test -- SUNMatGetID \n");
    }
    if (print_time != 0) {
      printf("    SUNMatGetID Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatGetID(SUNMatrix A, SUNMatrix_ID sunid, int myid)
{
  double start_time, stop_time;
  SUNMatrix_ID mysunid;

  start_time = get_time();
  mysunid    = SUNMatGetID(A);
  sync_device(A);
  stop_time = get_time();

  if (sunid != mysunid)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatGetID \n", myid);
    PRINT_TIME("    SUNMatGetID Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatGetID \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatGetID Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}